

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

bool __thiscall chatter::Protocol::disconnect(Protocol *this,Peer *peer)

{
  PeerState PVar1;
  size_t in_RCX;
  int in_R8D;
  ProtocolChannelID in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  ptr p;
  __shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  PVar1 = peer->m_state;
  if (PVar1 == CONNECTED) {
    Packet::create(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffbb);
    (p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_peer = peer;
    Packet::set_type(p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     DISCONNECT_NOTIFY);
    Packet::set_flag(p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     RELIABLE);
    std::__shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>);
    send(this,(int)&local_30,(void *)0x1,in_RCX,in_R8D);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return PVar1 == CONNECTED;
}

Assistant:

bool Protocol::disconnect(Peer* peer)
{
    if (peer->m_state != PeerState::CONNECTED)
        return false;

    auto p = Packet::create();
    p->m_peer = peer;
    p->set_type(PacketType::DISCONNECT_NOTIFY);
    p->set_flag(PacketFlag::RELIABLE);

    send(p, true);

    return true;
}